

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaggageRestrictionManager.cpp
# Opt level: O0

ssize_t __thiscall
jaegertracing::thrift::BaggageRestrictionManager_getBaggageRestrictions_result::write
          (BaggageRestrictionManager_getBaggageRestrictions_result *this,int __fd,void *__buf,
          size_t __n)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  size_type sVar4;
  reference pBVar5;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  __normal_iterator<const_jaegertracing::thrift::BaggageRestriction_*,_std::vector<jaegertracing::thrift::BaggageRestriction,_std::allocator<jaegertracing::thrift::BaggageRestriction>_>_>
  local_38;
  BaggageRestriction *local_30;
  __normal_iterator<const_jaegertracing::thrift::BaggageRestriction_*,_std::vector<jaegertracing::thrift::BaggageRestriction,_std::allocator<jaegertracing::thrift::BaggageRestriction>_>_>
  local_28;
  const_iterator _iter7;
  uint32_t xfer;
  TProtocol *oprot_local;
  BaggageRestrictionManager_getBaggageRestrictions_result *this_local;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  _iter7._M_current._4_4_ = 0;
  uVar2 = apache::thrift::protocol::TProtocol::writeStructBegin
                    (this_00,"BaggageRestrictionManager_getBaggageRestrictions_result");
  _iter7._M_current._4_4_ = uVar2 + _iter7._M_current._4_4_;
  if (((byte)this->__isset & 1) != 0) {
    uVar2 = apache::thrift::protocol::TProtocol::writeFieldBegin(this_00,"success",T_LIST,0);
    _iter7._M_current._4_4_ = uVar2 + _iter7._M_current._4_4_;
    sVar4 = std::
            vector<jaegertracing::thrift::BaggageRestriction,_std::allocator<jaegertracing::thrift::BaggageRestriction>_>
            ::size(&this->success);
    uVar2 = apache::thrift::protocol::TProtocol::writeListBegin(this_00,T_STRUCT,(uint32_t)sVar4);
    _iter7._M_current._4_4_ = uVar2 + _iter7._M_current._4_4_;
    __gnu_cxx::
    __normal_iterator<const_jaegertracing::thrift::BaggageRestriction_*,_std::vector<jaegertracing::thrift::BaggageRestriction,_std::allocator<jaegertracing::thrift::BaggageRestriction>_>_>
    ::__normal_iterator(&local_28);
    local_30 = (BaggageRestriction *)
               std::
               vector<jaegertracing::thrift::BaggageRestriction,_std::allocator<jaegertracing::thrift::BaggageRestriction>_>
               ::begin(&this->success);
    local_28._M_current = local_30;
    while( true ) {
      local_38._M_current =
           (BaggageRestriction *)
           std::
           vector<jaegertracing::thrift::BaggageRestriction,_std::allocator<jaegertracing::thrift::BaggageRestriction>_>
           ::end(&this->success);
      bVar1 = __gnu_cxx::operator!=(&local_28,&local_38);
      if (!bVar1) break;
      pBVar5 = __gnu_cxx::
               __normal_iterator<const_jaegertracing::thrift::BaggageRestriction_*,_std::vector<jaegertracing::thrift::BaggageRestriction,_std::allocator<jaegertracing::thrift::BaggageRestriction>_>_>
               ::operator*(&local_28);
      iVar3 = (**(code **)(*(long *)pBVar5 + 0x18))(pBVar5,this_00);
      _iter7._M_current._4_4_ = iVar3 + _iter7._M_current._4_4_;
      __gnu_cxx::
      __normal_iterator<const_jaegertracing::thrift::BaggageRestriction_*,_std::vector<jaegertracing::thrift::BaggageRestriction,_std::allocator<jaegertracing::thrift::BaggageRestriction>_>_>
      ::operator++(&local_28);
    }
    uVar2 = apache::thrift::protocol::TProtocol::writeListEnd(this_00);
    _iter7._M_current._4_4_ = uVar2 + _iter7._M_current._4_4_;
    uVar2 = apache::thrift::protocol::TProtocol::writeFieldEnd(this_00);
    _iter7._M_current._4_4_ = uVar2 + _iter7._M_current._4_4_;
  }
  uVar2 = apache::thrift::protocol::TProtocol::writeFieldStop(this_00);
  _iter7._M_current._4_4_ = uVar2 + _iter7._M_current._4_4_;
  uVar2 = apache::thrift::protocol::TProtocol::writeStructEnd(this_00);
  return (ulong)(uVar2 + _iter7._M_current._4_4_);
}

Assistant:

uint32_t BaggageRestrictionManager_getBaggageRestrictions_result::write(::apache::thrift::protocol::TProtocol* oprot) const {

  uint32_t xfer = 0;

  xfer += oprot->writeStructBegin("BaggageRestrictionManager_getBaggageRestrictions_result");

  if (this->__isset.success) {
    xfer += oprot->writeFieldBegin("success", ::apache::thrift::protocol::T_LIST, 0);
    {
      xfer += oprot->writeListBegin(::apache::thrift::protocol::T_STRUCT, static_cast<uint32_t>(this->success.size()));
      std::vector<BaggageRestriction> ::const_iterator _iter7;
      for (_iter7 = this->success.begin(); _iter7 != this->success.end(); ++_iter7)
      {
        xfer += (*_iter7).write(oprot);
      }
      xfer += oprot->writeListEnd();
    }
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}